

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

CKey DecodeSecret(string *str)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  pend;
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  secure_unique_ptr<KeyType> extraout_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CKey CVar6;
  bool compressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *privkey_prefix;
  CKey *key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CKey *in_stack_fffffffffffffef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  CChainParams *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int max_ret;
  undefined1 fCompressedIn;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff18;
  CKey *this;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff28;
  CKey local_20;
  long local_8;
  
  max_ret = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey(in_stack_fffffffffffffef8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8);
  bVar1 = DecodeBase58Check((string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_ffffffffffffff18._M_current,max_ret);
  if (bVar1) {
    Params();
    CChainParams::Base58Prefix
              (in_stack_ffffffffffffff08,(Base58Type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffef8);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffef8);
    if (sVar3 != sVar4 + 0x20) {
      in_stack_ffffffffffffff28._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffef8);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffef8);
      if ((in_stack_ffffffffffffff28._M_current != (uchar *)(sVar3 + 0x21)) ||
         (pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffef8), *pvVar5 != '\x01')) goto LAB_0067bb23;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff00);
    __last1._M_current._7_1_ = in_stack_ffffffffffffff27;
    __last1._M_current._0_7_ = in_stack_ffffffffffffff20;
    uVar2 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_ffffffffffffff28._M_current,__last1,in_stack_ffffffffffffff18);
    if ((bool)uVar2) {
      this = &local_20;
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffef8);
      fCompressedIn = (undefined1)(sVar3 >> 0x38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_ffffffffffffff08,(difference_type)in_stack_ffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_ffffffffffffff08,(difference_type)in_stack_ffffffffffffff00);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_ffffffffffffff08,(difference_type)in_stack_ffffffffffffff00);
      pend._M_current._7_1_ = uVar2;
      pend._M_current._0_7_ = in_stack_ffffffffffffff20;
      CKey::
      Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (this,in_stack_ffffffffffffff28,pend,(bool)fCompressedIn);
    }
  }
LAB_0067bb23:
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff08);
  if (!bVar1) {
    in_stack_ffffffffffffff08 =
         (CChainParams *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffef8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8);
    memory_cleanse(in_stack_fffffffffffffef8,0x67bb62);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    CVar6.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    CVar6._0_8_ = in_RDI;
    return CVar6;
  }
  __stack_chk_fail();
}

Assistant:

CKey DecodeSecret(const std::string& str)
{
    CKey key;
    std::vector<unsigned char> data;
    if (DecodeBase58Check(str, data, 34)) {
        const std::vector<unsigned char>& privkey_prefix = Params().Base58Prefix(CChainParams::SECRET_KEY);
        if ((data.size() == 32 + privkey_prefix.size() || (data.size() == 33 + privkey_prefix.size() && data.back() == 1)) &&
            std::equal(privkey_prefix.begin(), privkey_prefix.end(), data.begin())) {
            bool compressed = data.size() == 33 + privkey_prefix.size();
            key.Set(data.begin() + privkey_prefix.size(), data.begin() + privkey_prefix.size() + 32, compressed);
        }
    }
    if (!data.empty()) {
        memory_cleanse(data.data(), data.size());
    }
    return key;
}